

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TracyProfiler.cpp
# Opt level: O3

DequeueStatus __thiscall
tracy::Profiler::DequeueContextSwitches(Profiler *this,ConsumerToken *token,int64_t *timeStop)

{
  ConcurrentQueueProducerTypelessBase *pCVar1;
  long lVar2;
  bool bVar3;
  uint uVar4;
  uint32_t uVar5;
  DequeueStatus DVar6;
  ConcurrentQueueProducerTypelessBase *pCVar7;
  size_t sVar8;
  ConcurrentQueueProducerTypelessBase *pCVar9;
  uint uVar10;
  int iVar11;
  ConcurrentQueueProducerTypelessBase *pCVar12;
  DequeueStatus DVar13;
  uint32_t *puVar14;
  
  uVar5 = DAT_00952404;
  uVar4 = DAT_009523d8;
  pCVar9 = s_queue;
  if ((token->desiredProducer == (ConcurrentQueueProducerTypelessBase *)0x0) ||
     (token->lastKnownGlobalOffset != DAT_00952404)) {
    pCVar7 = token->desiredProducer;
    if (s_queue != (ConcurrentQueueProducerTypelessBase *)0x0 ||
        pCVar7 != (ConcurrentQueueProducerTypelessBase *)0x0) {
      if (pCVar7 == (ConcurrentQueueProducerTypelessBase *)0x0) {
        uVar10 = token->initialOffset % DAT_009523d8;
        pCVar7 = (ConcurrentQueueProducerTypelessBase *)&s_queue->inactive;
        if (s_queue == (ConcurrentQueueProducerTypelessBase *)0x0) {
          pCVar7 = s_queue;
        }
        token->desiredProducer = pCVar7;
        iVar11 = ~uVar10 + uVar4;
        pCVar12 = pCVar7;
        if (iVar11 != 0) {
          do {
            pCVar1 = pCVar12->next;
            puVar14 = &pCVar1[-1].threadId;
            if (pCVar1 == (ConcurrentQueueProducerTypelessBase *)0x0) {
              puVar14 = (uint32_t *)0x0;
            }
            pCVar12 = (ConcurrentQueueProducerTypelessBase *)(puVar14 + 2);
            if (pCVar1 == (ConcurrentQueueProducerTypelessBase *)0x0) {
              pCVar12 = pCVar7;
            }
            iVar11 = iVar11 + -1;
          } while (iVar11 != 0);
          token->desiredProducer = pCVar12;
          pCVar7 = pCVar12;
        }
      }
      uVar10 = uVar5 - token->lastKnownGlobalOffset;
      if (uVar4 <= uVar10) {
        uVar10 = uVar10 % uVar4;
      }
      if (uVar10 != 0) {
        pCVar12 = (ConcurrentQueueProducerTypelessBase *)&pCVar9->inactive;
        if (pCVar9 == (ConcurrentQueueProducerTypelessBase *)0x0) {
          pCVar12 = pCVar9;
        }
        do {
          pCVar9 = pCVar7->next;
          puVar14 = &pCVar9[-1].threadId;
          if (pCVar9 == (ConcurrentQueueProducerTypelessBase *)0x0) {
            puVar14 = (uint32_t *)0x0;
          }
          pCVar7 = (ConcurrentQueueProducerTypelessBase *)(puVar14 + 2);
          if (pCVar9 == (ConcurrentQueueProducerTypelessBase *)0x0) {
            pCVar7 = pCVar12;
          }
          uVar10 = uVar10 - 1;
        } while (uVar10 != 0);
        token->desiredProducer = pCVar7;
      }
      token->lastKnownGlobalOffset = uVar5;
      token->currentProducer = pCVar7;
      token->itemsConsumedFromCurrent = 0;
      goto LAB_0037f3f6;
    }
  }
  else {
    pCVar7 = token->currentProducer;
LAB_0037f3f6:
    sVar8 = moodycamel::
            ConcurrentQueue<tracy::QueueItem,tracy::moodycamel::ConcurrentQueueDefaultTraits>::
            ProducerBase::
            dequeue_bulk<tracy::Profiler::DequeueContextSwitches(tracy::moodycamel::ConsumerToken&,long&)::__0,tracy::Profiler::DequeueContextSwitches(tracy::moodycamel::ConsumerToken&,long&)::__1>
                      ((ProducerBase *)&pCVar7[-1].threadId,this,timeStop);
    token->itemsConsumedFromCurrent = token->itemsConsumedFromCurrent + (int)sVar8;
    pCVar7 = s_queue;
    pCVar9 = token->currentProducer->next;
    pCVar12 = (ConcurrentQueueProducerTypelessBase *)&pCVar9[-1].threadId;
    if (pCVar9 == (ConcurrentQueueProducerTypelessBase *)0x0) {
      pCVar12 = s_queue;
    }
    if (sVar8 != 0) {
      pCVar9 = (ConcurrentQueueProducerTypelessBase *)&pCVar12->inactive;
      if (pCVar12 == (ConcurrentQueueProducerTypelessBase *)0x0) {
        pCVar9 = (ConcurrentQueueProducerTypelessBase *)0x0;
      }
      token->currentProducer = pCVar9;
      sVar8 = 0;
LAB_0037f439:
      token->itemsConsumedFromCurrent = (uint32_t)sVar8;
      bVar3 = true;
      goto LAB_0037f483;
    }
    pCVar9 = (ConcurrentQueueProducerTypelessBase *)&token->currentProducer[-1].threadId;
    while (pCVar12 != pCVar9) {
      sVar8 = moodycamel::
              ConcurrentQueue<tracy::QueueItem,tracy::moodycamel::ConcurrentQueueDefaultTraits>::
              ProducerBase::
              dequeue_bulk<tracy::Profiler::DequeueContextSwitches(tracy::moodycamel::ConsumerToken&,long&)::__0,tracy::Profiler::DequeueContextSwitches(tracy::moodycamel::ConsumerToken&,long&)::__1>
                        ((ProducerBase *)pCVar12,this,timeStop);
      if (sVar8 != 0) {
        token->currentProducer = (ConcurrentQueueProducerTypelessBase *)&pCVar12->inactive;
        goto LAB_0037f439;
      }
      lVar2 = *(long *)&(pCVar12->inactive)._M_base;
      pCVar12 = (ConcurrentQueueProducerTypelessBase *)(lVar2 + -8);
      if (lVar2 == 0) {
        pCVar12 = pCVar7;
      }
      pCVar9 = (ConcurrentQueueProducerTypelessBase *)&token->currentProducer[-1].threadId;
      if (token->currentProducer == (ConcurrentQueueProducerTypelessBase *)0x0) {
        pCVar9 = (ConcurrentQueueProducerTypelessBase *)0x0;
      }
    }
  }
  bVar3 = false;
LAB_0037f483:
  DVar13 = DataDequeued;
  if (!bVar3) {
    DVar13 = (uint)(*timeStop != -1) * 2;
  }
  DVar6 = ConnectionLost;
  if (*timeStop != -2) {
    DVar6 = DVar13;
  }
  return DVar6;
}

Assistant:

Profiler::DequeueStatus Profiler::DequeueContextSwitches( tracy::moodycamel::ConsumerToken& token, int64_t& timeStop )
{
    const auto sz = GetQueue().try_dequeue_bulk_single( token, [] ( const uint64_t& ) {},
        [this, &timeStop] ( QueueItem* item, size_t sz )
        {
            assert( sz > 0 );
            int64_t refCtx = m_refTimeCtx;
            while( sz-- > 0 )
            {
                FreeAssociatedMemory( *item );
                if( timeStop < 0 ) return;
                const auto idx = MemRead<uint8_t>( &item->hdr.idx );
                if( idx == (uint8_t)QueueType::ContextSwitch )
                {
                    const auto csTime = MemRead<int64_t>( &item->contextSwitch.time );
                    if( csTime > timeStop )
                    {
                        timeStop = -1;
                        m_refTimeCtx = refCtx;
                        return;
                    }
                    int64_t dt = csTime - refCtx;
                    refCtx = csTime;
                    MemWrite( &item->contextSwitch.time, dt );
                    if( !AppendData( item, QueueDataSize[(int)QueueType::ContextSwitch] ) )
                    {
                        timeStop = -2;
                        m_refTimeCtx = refCtx;
                        return;
                    }
                }
                else if( idx == (uint8_t)QueueType::ThreadWakeup )
                {
                    const auto csTime = MemRead<int64_t>( &item->threadWakeup.time );
                    if( csTime > timeStop )
                    {
                        timeStop = -1;
                        m_refTimeCtx = refCtx;
                        return;
                    }
                    int64_t dt = csTime - refCtx;
                    refCtx = csTime;
                    MemWrite( &item->threadWakeup.time, dt );
                    if( !AppendData( item, QueueDataSize[(int)QueueType::ThreadWakeup] ) )
                    {
                        timeStop = -2;
                        m_refTimeCtx = refCtx;
                        return;
                    }
                }
                item++;
            }
            m_refTimeCtx = refCtx;
        }
    );

    if( timeStop == -2 ) return DequeueStatus::ConnectionLost;
    return ( timeStop == -1 || sz > 0 ) ? DequeueStatus::DataDequeued : DequeueStatus::QueueEmpty;
}